

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O1

void __thiscall kratos::IfStmt::set_predicate(IfStmt *this,shared_ptr<kratos::Var> *var)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  undefined8 uVar3;
  pointer ppVar4;
  uint32_t width;
  int iVar5;
  undefined1 local_48 [24];
  pointer ppStack_30;
  
  (*(((this->predicate_stmt_).super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr)->super_Stmt).super_IRNode._vptr_IRNode[0xc])();
  peVar1 = (var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((peVar1->super_IRNode).ast_node_type_ == VarKind) {
    (this->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &(var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
    width = (*(((this->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_IRNode)._vptr_IRNode[0xd])();
    iVar5 = (*(((this->predicate_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_IRNode)._vptr_IRNode[7])();
    Generator::get_auxiliary_var((Generator *)local_48,width,SUB41(iVar5,0));
    Var::assign((Var *)(local_48 + 0x10),(shared_ptr<kratos::Var> *)local_48._0_8_);
    ppVar4 = ppStack_30;
    uVar3 = local_48._16_8_;
    local_48._16_8_ = (pointer)0x0;
    ppStack_30 = (pointer)0x0;
    this_00 = (this->predicate_stmt_).
              super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->predicate_stmt_).super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)uVar3;
    (this->predicate_stmt_).super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppVar4;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (ppStack_30 != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppStack_30);
    }
    if ((pointer)local_48._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    }
    peVar2 = (this->predicate_stmt_).
             super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*(peVar2->super_Stmt).super_IRNode._vptr_IRNode[7])(peVar2,this);
    return;
  }
  __assert_fail("var->ir_node_kind() == IRNodeKind::VarKind",
                "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/stmt.cc",0xf7,
                "void kratos::IfStmt::set_predicate(const std::shared_ptr<Var> &)");
}

Assistant:

void IfStmt::set_predicate(const std::shared_ptr<Var> &var) {
    predicate_stmt_->clear();
    assert(var->ir_node_kind() == IRNodeKind::VarKind);
    predicate_ = var;
    predicate_stmt_ =
        predicate_->generator()->get_auxiliary_var(predicate_->width())->assign(predicate_);
    predicate_stmt_->set_parent(this);
}